

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

uint64_t __thiscall tcmalloc::Span::InitFreeList(Span *this,uint64_t obj_bytes)

{
  ulong uVar1;
  undefined8 *puVar2;
  uint64_t uVar3;
  
  if (this->location == 0) {
    (this->freelist).free_count_ = 0;
    (this->freelist).head_ = (void *)0x0;
    puVar2 = (undefined8 *)(this->page_id * 0x2000);
    uVar1 = (this->page_id + this->npages) * 0x2000;
    if ((long)puVar2 + obj_bytes <= uVar1) {
      uVar3 = (this->freelist).free_count_;
      do {
        *puVar2 = (this->freelist).head_;
        (this->freelist).head_ = puVar2;
        uVar3 = uVar3 + 1;
        puVar2 = (undefined8 *)((long)puVar2 + obj_bytes);
      } while (obj_bytes + (long)puVar2 <= uVar1);
      (this->freelist).free_count_ = uVar3;
    }
    return (long)(int)(this->freelist).free_count_;
  }
  __assert_fail("location == IN_USE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/span.hpp"
                ,0x42,"uint64_t tcmalloc::Span::InitFreeList(uint64_t)");
}

Assistant:

uint64_t InitFreeList(uint64_t obj_bytes) {
        assert(location == IN_USE);
        freelist.Clear();
        assert(freelist.Empty());
        uint64_t ptr = reinterpret_cast<uint64_t>(reinterpret_cast<char *>(page_id * spanPageSize));
        uint64_t limit = ptr + (npages * spanPageSize);
        while (ptr + obj_bytes <= limit) {
            freelist.PushFront((void*)ptr);
            ptr += obj_bytes;
        }
        return freelist.FreeObjects();
    }